

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O1

bool global_collect_tree(Node *node,IdentTree *tree)

{
  pointer *ppbVar1;
  NodeType NVar2;
  Node *pNVar3;
  long *plVar4;
  long lVar5;
  bool bVar6;
  IdentTree *pIVar7;
  _Rb_tree_header *p_Var8;
  pointer ppNVar9;
  Node *node_00;
  ulong uVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  path;
  allocator local_89;
  undefined1 local_88 [32];
  void *local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  undefined8 uStack_40;
  
  if (tree == (IdentTree *)0x0 || node == (Node *)0x0) {
    return false;
  }
  if (node->nodeType == PNT_STATEMENT_LIST) {
    ppNVar9 = (node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish == ppNVar9) {
      return true;
    }
    uVar10 = 0;
    do {
      pNVar3 = ppNVar9[uVar10];
      if (pNVar3 != (Node *)0x0) {
        if (((pNVar3->nodeType == PNT_BINARY_OP) && (pNVar3->tok->type == TK_NEWSLOT)) ||
           (((pNVar3->nodeType & ~PNT_NULL) == PNT_CLASS &&
            (*(pNVar3->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_start != (Node *)0x0)))) {
          node_to_path_abi_cxx11_
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_88,
                     *(pNVar3->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
                      .super__Vector_impl_data._M_start);
          pIVar7 = (IdentTree *)operator_new(0x48);
          p_Var8 = &(pIVar7->children)._M_t._M_impl.super__Rb_tree_header;
          (pIVar7->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          (pIVar7->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
          ;
          (pIVar7->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &p_Var8->_M_header;
          (pIVar7->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               &p_Var8->_M_header;
          (pIVar7->children)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          (pIVar7->extends).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (pIVar7->extends).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (pIVar7->extends).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          node_00 = pNVar3;
          if (pNVar3->nodeType == PNT_BINARY_OP) {
            node_00 = (pNVar3->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
                      .super__Vector_impl_data._M_start[1];
          }
          bVar6 = global_collect_tree(node_00,pIVar7);
          if (!bVar6) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&pIVar7->extends);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentTree_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentTree_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentTree_*>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentTree_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentTree_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentTree_*>_>_>
                         *)pIVar7);
            operator_delete(pIVar7);
            pIVar7 = (IdentTree *)0x0;
          }
          set_sub_tree_by_path
                    (tree,pIVar7,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_88);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_88);
        }
        if (pNVar3->nodeType == PNT_FUNCTION) {
          node_to_path_abi_cxx11_
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_88,
                     *(pNVar3->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
                      .super__Vector_impl_data._M_start);
          set_sub_tree_by_path
                    (tree,(IdentTree *)0x0,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_88);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_88);
        }
        if (pNVar3->nodeType == PNT_GLOBAL_ENUM) {
          std::__cxx11::string::string
                    ((string *)&local_58,
                     ((*(pNVar3->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                        _M_impl.super__Vector_impl_data._M_start)->tok->u).s,&local_89);
          local_88._0_8_ = local_88 + 0x10;
          ppbVar1 = &local_58.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          if (local_58.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == (pointer)ppbVar1) {
            local_88._24_8_ = uStack_40;
          }
          else {
            local_88._0_8_ =
                 local_58.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          }
          local_88._16_8_ =
               local_58.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_88._8_8_ =
               local_58.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_58.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_58.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)((ulong)local_58.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage &
                        0xffffffffffffff00);
          local_68 = (void *)0x0;
          local_58.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar1;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,IdentTree*>,std::_Select1st<std::pair<std::__cxx11::string_const,IdentTree*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,IdentTree*>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,decltype(nullptr)>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,IdentTree*>,std::_Select1st<std::pair<std::__cxx11::string_const,IdentTree*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,IdentTree*>>>
                      *)&ident_root,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::nullptr_t>
                      *)local_88);
          if ((pointer)local_88._0_8_ != (pointer)(local_88 + 0x10)) {
            operator_delete((void *)local_88._0_8_);
          }
          if (local_58.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (pointer)&local_58.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            operator_delete(local_58.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
        }
        if (pNVar3->nodeType == PNT_IF_ELSE) {
          global_collect_tree((pNVar3->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[1],tree);
          ppNVar9 = (pNVar3->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (0x10 < (ulong)((long)(pNVar3->children).
                                   super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)ppNVar9)) {
            global_collect_tree(ppNVar9[2],tree);
          }
        }
        if ((((pNVar3->nodeType == PNT_LOCAL_VAR_DECLARATION) &&
             (ppNVar9 = (pNVar3->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
             (pNVar3->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
             super__Vector_impl_data._M_finish != ppNVar9)) &&
            (pNVar3 = *ppNVar9, pNVar3->nodeType == PNT_VAR_DECLARATOR)) &&
           (ppNVar9 = (pNVar3->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
                      .super__Vector_impl_data._M_start,
           (long)(pNVar3->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)ppNVar9 == 0x10)) {
          pNVar3 = ppNVar9[1];
          if (((pNVar3 != (Node *)0x0 && *ppNVar9 != (Node *)0x0) && (pNVar3->nodeType == PNT_CLASS)
              ) && ((pNVar3->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start[1] != (Node *)0x0)) {
            node_to_path_abi_cxx11_
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_88,*ppNVar9);
            pIVar7 = (IdentTree *)operator_new(0x48);
            p_Var8 = &(pIVar7->children)._M_t._M_impl.super__Rb_tree_header;
            (pIVar7->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            (pIVar7->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            (pIVar7->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &p_Var8->_M_header;
            (pIVar7->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 &p_Var8->_M_header;
            (pIVar7->children)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            (pIVar7->extends).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pIVar7->extends).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pIVar7->extends).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            global_collect_tree(pNVar3,pIVar7);
            set_sub_tree_by_path
                      (tree,pIVar7,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_88);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_88);
          }
        }
      }
      uVar10 = uVar10 + 1;
      ppNVar9 = (node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar10 < (ulong)((long)(node->children).
                                    super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)ppNVar9 >> 3));
  }
  else {
    if ((node->nodeType == PNT_BINARY_OP) && (node->tok->type == TK_NEWSLOT)) {
      node_to_path_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_88,
                 *(node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start);
      pIVar7 = (IdentTree *)operator_new(0x48);
      p_Var8 = &(pIVar7->children)._M_t._M_impl.super__Rb_tree_header;
      (pIVar7->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      (pIVar7->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (pIVar7->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var8->_M_header;
      (pIVar7->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var8->_M_header;
      (pIVar7->children)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      (pIVar7->extends).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pIVar7->extends).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pIVar7->extends).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar6 = global_collect_tree((node->children).
                                  super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                  super__Vector_impl_data._M_start[1],pIVar7);
      if (!bVar6) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&pIVar7->extends);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentTree_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentTree_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentTree_*>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentTree_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentTree_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentTree_*>_>_>
                     *)pIVar7);
        operator_delete(pIVar7);
        pIVar7 = (IdentTree *)0x0;
      }
      set_sub_tree_by_path
                (tree,pIVar7,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_88);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_88);
    }
    NVar2 = node->nodeType;
    if (0x35 < (ulong)NVar2) {
      return false;
    }
    if ((0x30000004000000U >> ((ulong)NVar2 & 0x3f) & 1) == 0) {
      return false;
    }
    if ((NVar2 & ~PNT_NULL) == PNT_CLASS) {
      ppNVar9 = (node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar10 = 3;
      if (ppNVar9[1] != (Node *)0x0) {
        node_to_path_abi_cxx11_(&local_58,ppNVar9[1]);
        local_88._0_8_ =
             (tree->extends).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_88._8_8_ =
             (tree->extends).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_88._16_8_ =
             (tree->extends).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (tree->extends).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_58.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (tree->extends).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_58.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (tree->extends).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_58.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_88);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_58);
      }
    }
    else {
      uVar10 = 0;
    }
    ppNVar9 = (node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppNVar9 >> 3) <= uVar10) {
      return true;
    }
    do {
      pNVar3 = ppNVar9[uVar10];
      if ((((pNVar3 != (Node *)0x0) && ((ulong)pNVar3->nodeType < 0x3d)) &&
          ((0x1800000000000100U >> ((ulong)pNVar3->nodeType & 0x3f) & 1) != 0)) &&
         (plVar4 = *(long **)&(pNVar3->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>
                              ._M_impl.super__Vector_impl_data, *plVar4 != 0)) {
        node_to_path_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_88,(Node *)*plVar4);
        pIVar7 = (IdentTree *)operator_new(0x48);
        p_Var8 = &(pIVar7->children)._M_t._M_impl.super__Rb_tree_header;
        (pIVar7->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        (pIVar7->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        (pIVar7->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var8->_M_header
        ;
        (pIVar7->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             &p_Var8->_M_header;
        (pIVar7->children)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        (pIVar7->extends).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pIVar7->extends).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pIVar7->extends).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        lVar5 = *(long *)&(pNVar3->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                          _M_impl.super__Vector_impl_data;
        if (((ulong)((long)*(pointer *)
                            ((long)&(pNVar3->children).
                                    super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl + 8)
                    - lVar5) < 9) ||
           (bVar6 = global_collect_tree(*(Node **)(lVar5 + 8),pIVar7), !bVar6)) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&pIVar7->extends);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentTree_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentTree_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentTree_*>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentTree_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentTree_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentTree_*>_>_>
                       *)pIVar7);
          operator_delete(pIVar7);
          pIVar7 = (IdentTree *)0x0;
        }
        set_sub_tree_by_path
                  (tree,pIVar7,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_88);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_88);
      }
      uVar10 = uVar10 + 1;
      ppNVar9 = (node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar10 < (ulong)((long)(node->children).
                                    super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)ppNVar9 >> 3));
  }
  return true;
}

Assistant:

static bool global_collect_tree(Node * node, IdentTree * tree)
{
  if (!node || !tree)
    return false;

  if (node->nodeType == PNT_BINARY_OP && node->tok.type == TK_NEWSLOT)
  {
    vector<string> path = node_to_path(node->children[0]);
    IdentTree * subTree = new IdentTree;
    if (!global_collect_tree(node->children[1], subTree))
    {
      delete subTree;
      subTree = nullptr;
    }
    set_sub_tree_by_path(tree, subTree, path);
  }
  else if (node->nodeType == PNT_STATEMENT_LIST) // root
  {
    for (size_t i = 0; i < node->children.size(); i++)
    {
      Node * cur = node->children[i];
      if (!cur)
        continue;

      if ((cur->nodeType == PNT_BINARY_OP && cur->tok.type == TK_NEWSLOT) ||
        ((cur->nodeType == PNT_CLASS || cur->nodeType == PNT_LOCAL_CLASS) && cur->children[0]))
      {
        vector<string> path = node_to_path(cur->children[0]);
        IdentTree * subTree = new IdentTree;
        if (!global_collect_tree(cur->nodeType == PNT_BINARY_OP ? cur->children[1] : cur, subTree))
        {
          delete subTree;
          subTree = nullptr;
        }
        set_sub_tree_by_path(tree, subTree, path);
      }

      if (cur->nodeType == PNT_FUNCTION)
      {
        vector<string> path = node_to_path(cur->children[0]);
        set_sub_tree_by_path(tree, nullptr, path);
      }

      if (cur->nodeType == PNT_GLOBAL_ENUM)
      {
        ident_root.children.insert(make_pair(string(cur->children[0]->tok.u.s), nullptr));
      }

      if (cur->nodeType == PNT_IF_ELSE)
      {
        global_collect_tree(cur->children[1], tree);
        if (cur->children.size() > 2) // else-node
          global_collect_tree(cur->children[2], tree);
      }


      // local ClassName = class extends XXXX {}
      if (cur->nodeType == PNT_LOCAL_VAR_DECLARATION && cur->children.size() > 0 &&
        cur->children[0]->nodeType == PNT_VAR_DECLARATOR && cur->children[0]->children.size() == 2)
      {
        Node * nameNode = cur->children[0]->children[0];
        Node * classNode = cur->children[0]->children[1];
        if (nameNode && classNode && classNode->nodeType == PNT_CLASS && classNode->children[1]) // children[1] - extends
        {
          vector<string> path = node_to_path(nameNode);
          IdentTree * subTree = new IdentTree;
          global_collect_tree(classNode, subTree);
          set_sub_tree_by_path(tree, subTree, path);
        }
      }
    }
    return true;
  }

  if (node->nodeType == PNT_TABLE_CREATION || node->nodeType == PNT_CLASS || node->nodeType == PNT_LOCAL_CLASS)
  {
    bool isClass = (node->nodeType == PNT_CLASS || node->nodeType == PNT_LOCAL_CLASS);
    if (isClass && node->children[1])
      tree->extends = node_to_path(node->children[1]);

    for (size_t i = isClass ? 3 : 0; i < node->children.size(); i++)
    {
      Node * cur = node->children[i];
      if (!cur)
        continue;

      if (cur->nodeType == PNT_KEY_VALUE || cur->nodeType == PNT_CLASS_MEMBER || cur->nodeType == PNT_STATIC_CLASS_MEMBER)
        if (cur->children[0])
        {
          vector<string> path = node_to_path(cur->children[0]);
          IdentTree * subTree = new IdentTree;
          if (cur->children.size() < 2 || !global_collect_tree(cur->children[1], subTree))
          {
            delete subTree;
            subTree = nullptr;
          }
          set_sub_tree_by_path(tree, subTree, path);
        }
    }
    return true;
  }

  return false;
}